

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O1

string * chaiscript::Build_Info::compiler_id_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  string *in_RDI;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6e616c63;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x67;
  local_50._M_string_length = 5;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_50,5,0,1,'-');
  paVar2 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar5) {
    local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_78._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_78._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  paVar5 = &local_98.field_2;
  local_58 = 0x65;
  local_98._M_dataplus._M_p = (pointer)paVar5;
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_98,&local_58,0);
  __n = local_58;
  local_98.field_2._M_allocated_capacity = local_58;
  local_98._M_dataplus._M_p = pcVar4;
  memcpy(pcVar4,
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
         ,0x65);
  local_98._M_string_length = __n;
  pcVar4[__n] = '\0';
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    uVar6 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < __n + local_78._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar5) {
      uVar6 = local_98.field_2._M_allocated_capacity;
    }
    if (__n + local_78._M_string_length <= (ulong)uVar6) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_98,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
      goto LAB_0025abca;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_78,local_98._M_dataplus._M_p,__n);
LAB_0025abca:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar4 = (pbVar3->_M_dataplus)._M_p;
  paVar1 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar6 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar6;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar4;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar3->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar5) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT26(local_50.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_50.field_2._M_allocated_capacity._4_2_,
                                      local_50.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  return in_RDI;
}

Assistant:

[[nodiscard]] static std::string compiler_id() { return compiler_name() + '-' + compiler_version(); }